

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDDOMParser::startAnnotationElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,RefVectorOf<xercesc_4_0::XMLAttr> *attrList,
          XMLSize_t attrCount)

{
  XMLCh *pXVar1;
  XMLAttr *this_00;
  XMLSize_t i;
  XMLSize_t getAt;
  XMLBuffer *this_01;
  
  this_01 = &this->fAnnotationBuf;
  XMLBuffer::append(this_01,L'<');
  pXVar1 = XMLElementDecl::getFullName(elemDecl);
  XMLBuffer::append(this_01,pXVar1);
  for (getAt = 0; attrCount != getAt; getAt = getAt + 1) {
    this_00 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                        (&attrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
    XMLBuffer::append(this_01,L' ');
    pXVar1 = XMLAttr::getQName(this_00);
    XMLBuffer::append(this_01,pXVar1);
    XMLBuffer::append(this_01,L'=');
    XMLBuffer::append(this_01,L'\"');
    XMLBuffer::append(this_01,this_00->fValue);
    XMLBuffer::append(this_01,L'\"');
  }
  XMLBuffer::append(this_01,L'>');
  return;
}

Assistant:

void XSDDOMParser::startAnnotationElement( const XMLElementDecl&       elemDecl
                                         , const RefVectorOf<XMLAttr>& attrList
                                         , const XMLSize_t             attrCount)
{
    fAnnotationBuf.append(chOpenAngle);
    fAnnotationBuf.append(elemDecl.getFullName());
    //fAnnotationBuf.append(chSpace);

    for(XMLSize_t i=0; i < attrCount; i++) {

        const XMLAttr* oneAttr = attrList.elementAt(i);
        fAnnotationBuf.append(chSpace);
        fAnnotationBuf.append(oneAttr ->getQName());
        fAnnotationBuf.append(chEqual);
        fAnnotationBuf.append(chDoubleQuote);
        fAnnotationBuf.append(oneAttr->getValue());
        fAnnotationBuf.append(chDoubleQuote);
    }

    fAnnotationBuf.append(chCloseAngle);
}